

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edit_distance.h
# Opt level: O3

uint llvm::ComputeEditDistance<char>
               (ArrayRef<char> FromArray,ArrayRef<char> ToArray,bool AllowReplacements,
               uint MaxEditDistance)

{
  ulong uVar1;
  bool bVar2;
  uint *puVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  uint *puVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  uint *puVar16;
  ulong uVar17;
  uint SmallBuffer [64];
  uint *local_158;
  uint local_138 [66];
  
  uVar5 = ToArray.Length;
  uVar11 = FromArray.Length;
  uVar12 = uVar5 + 1;
  if (uVar12 < 0x41) {
    puVar3 = local_138;
    local_158 = (uint *)0x0;
    if (uVar5 == 0) {
      bVar2 = true;
      goto LAB_001661c2;
    }
  }
  else {
    puVar3 = (uint *)operator_new__(-(ulong)(uVar12 >> 0x3e != 0) | uVar12 * 4);
    local_158 = puVar3;
  }
  uVar12 = 1;
  do {
    puVar3[uVar12] = (uint)uVar12;
    uVar12 = (ulong)((uint)uVar12 + 1);
  } while (uVar12 <= uVar5);
  bVar2 = false;
LAB_001661c2:
  if (uVar11 != 0) {
    uVar4 = MaxEditDistance + 1;
    uVar12 = 1;
    do {
      uVar10 = (uint)uVar12;
      *puVar3 = uVar10;
      if (!bVar2) {
        uVar1 = uVar12 - 1;
        uVar6 = uVar12 & 0xffffffff;
        uVar13 = uVar1 & 0xffffffff;
        uVar14 = uVar12 & 0xffffffff;
        pcVar15 = ToArray.Data;
        uVar17 = uVar5;
        puVar9 = puVar3;
        do {
          puVar16 = puVar9 + 1;
          uVar7 = (uint)uVar13;
          uVar10 = *puVar16;
          uVar13 = (ulong)uVar10;
          if (AllowReplacements) {
            if (uVar11 <= uVar1) {
LAB_001662dd:
              __assert_fail("Index < Length && \"Invalid index!\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/ArrayRef.h"
                            ,0xf1,
                            "const T &llvm::ArrayRef<char>::operator[](size_t) const [T = char]");
            }
            uVar8 = uVar7 + (FromArray.Data[uVar1] != *pcVar15);
            if (uVar10 < (uint)uVar6) {
              puVar9 = puVar16;
            }
            uVar7 = *puVar9 + 1;
            if (uVar8 <= *puVar9 + 1) {
              uVar7 = uVar8;
            }
          }
          else {
            if (uVar11 <= uVar1) goto LAB_001662dd;
            if (FromArray.Data[uVar1] != *pcVar15) {
              if (uVar10 < (uint)uVar6) {
                puVar9 = puVar16;
              }
              uVar7 = *puVar9 + 1;
            }
          }
          *puVar16 = uVar7;
          if (uVar7 < (uint)uVar14) {
            uVar14 = (ulong)uVar7;
          }
          uVar10 = (uint)uVar14;
          pcVar15 = pcVar15 + 1;
          uVar6 = (ulong)uVar7;
          uVar17 = uVar17 - 1;
          puVar9 = puVar16;
        } while (uVar17 != 0);
      }
      if ((MaxEditDistance != 0) && (MaxEditDistance < uVar10)) goto LAB_001662af;
      uVar12 = uVar12 + 1;
    } while (uVar12 <= uVar11);
  }
  uVar4 = puVar3[uVar5];
LAB_001662af:
  if (local_158 != (uint *)0x0) {
    operator_delete__(local_158);
  }
  return uVar4;
}

Assistant:

unsigned ComputeEditDistance(ArrayRef<T> FromArray, ArrayRef<T> ToArray,
                             bool AllowReplacements = true,
                             unsigned MaxEditDistance = 0) {
  // The algorithm implemented below is the "classic"
  // dynamic-programming algorithm for computing the Levenshtein
  // distance, which is described here:
  //
  //   http://en.wikipedia.org/wiki/Levenshtein_distance
  //
  // Although the algorithm is typically described using an m x n
  // array, only one row plus one element are used at a time, so this
  // implementation just keeps one vector for the row.  To update one entry,
  // only the entries to the left, top, and top-left are needed.  The left
  // entry is in Row[x-1], the top entry is what's in Row[x] from the last
  // iteration, and the top-left entry is stored in Previous.
  typename ArrayRef<T>::size_type m = FromArray.size();
  typename ArrayRef<T>::size_type n = ToArray.size();

  const unsigned SmallBufferSize = 64;
  unsigned SmallBuffer[SmallBufferSize];
  std::unique_ptr<unsigned[]> Allocated;
  unsigned *Row = SmallBuffer;
  if (n + 1 > SmallBufferSize) {
    Row = new unsigned[n + 1];
    Allocated.reset(Row);
  }

  for (unsigned i = 1; i <= n; ++i)
    Row[i] = i;

  for (typename ArrayRef<T>::size_type y = 1; y <= m; ++y) {
    Row[0] = y;
    unsigned BestThisRow = Row[0];

    unsigned Previous = y - 1;
    for (typename ArrayRef<T>::size_type x = 1; x <= n; ++x) {
      int OldRow = Row[x];
      if (AllowReplacements) {
        Row[x] = std::min(
            Previous + (FromArray[y-1] == ToArray[x-1] ? 0u : 1u),
            std::min(Row[x-1], Row[x])+1);
      }
      else {
        if (FromArray[y-1] == ToArray[x-1]) Row[x] = Previous;
        else Row[x] = std::min(Row[x-1], Row[x]) + 1;
      }
      Previous = OldRow;
      BestThisRow = std::min(BestThisRow, Row[x]);
    }

    if (MaxEditDistance && BestThisRow > MaxEditDistance)
      return MaxEditDistance + 1;
  }

  unsigned Result = Row[n];
  return Result;
}